

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O3

void xmlSchemaContentModelDump(xmlSchemaParticlePtr particle,FILE *output,int depth)

{
  xmlSchemaTreeItemPtr_conflict pxVar1;
  xmlChar *pxVar2;
  uint uVar3;
  size_t sVar4;
  char *pcVar5;
  ulong __n;
  char shift [100];
  xmlChar *local_a0;
  char local_98 [152];
  
  do {
    local_a0 = (xmlChar *)0x0;
    if (depth < 1) {
      __n = 0;
    }
    else {
      uVar3 = 0x18;
      if (depth - 1U < 0x18) {
        uVar3 = depth - 1U;
      }
      __n = (ulong)(uVar3 * 2 + 2);
      memset(local_98,0x20,__n);
    }
    (local_98 + __n)[0] = '\0';
    (local_98 + __n)[1] = '\0';
    fputs(local_98,(FILE *)output);
    pxVar1 = particle->children;
    if (pxVar1 == (xmlSchemaTreeItemPtr_conflict)0x0) {
      pcVar5 = "MISSING particle term\n";
      sVar4 = 0x16;
      goto LAB_00191b10;
    }
    switch(pxVar1->type) {
    case XML_SCHEMA_TYPE_SEQUENCE:
      pcVar5 = "SEQUENCE";
      sVar4 = 8;
      break;
    case XML_SCHEMA_TYPE_CHOICE:
      pcVar5 = "CHOICE";
      sVar4 = 6;
      break;
    case XML_SCHEMA_TYPE_ALL:
      pcVar5 = "ALL";
      goto LAB_00191b34;
    case XML_SCHEMA_TYPE_SIMPLE_CONTENT:
    case XML_SCHEMA_TYPE_COMPLEX_CONTENT:
    case XML_SCHEMA_TYPE_UR:
    case XML_SCHEMA_TYPE_RESTRICTION:
    case XML_SCHEMA_TYPE_EXTENSION:
switchD_00191ad5_caseD_9:
      pcVar5 = "UNKNOWN\n";
      sVar4 = 8;
LAB_00191b10:
      fwrite(pcVar5,sVar4,1,(FILE *)output);
      return;
    case XML_SCHEMA_TYPE_ELEMENT:
      pxVar2 = xmlSchemaFormatQName(&local_a0,*(xmlChar **)(pxVar1 + 3),(xmlChar *)pxVar1->next);
      fprintf((FILE *)output,"ELEM \'%s\'",pxVar2);
      if (local_a0 != (xmlChar *)0x0) {
        (*xmlFree)(local_a0);
      }
      goto LAB_00191b91;
    default:
      if (pxVar1->type != XML_SCHEMA_TYPE_ANY) goto switchD_00191ad5_caseD_9;
      pcVar5 = "ANY";
LAB_00191b34:
      sVar4 = 3;
    }
    fwrite(pcVar5,sVar4,1,(FILE *)output);
LAB_00191b91:
    if (particle->minOccurs != 1) {
      fprintf((FILE *)output," min: %d");
    }
    if (particle->maxOccurs < 0x40000000) {
      if (particle->maxOccurs != 1) {
        fprintf((FILE *)output," max: %d");
      }
    }
    else {
      fwrite(" max: unbounded",0xf,1,(FILE *)output);
    }
    fputc(10,(FILE *)output);
    if ((pxVar1->type - XML_SCHEMA_TYPE_SEQUENCE < 3) &&
       ((xmlSchemaParticlePtr)pxVar1->children != (xmlSchemaParticlePtr)0x0)) {
      xmlSchemaContentModelDump((xmlSchemaParticlePtr)pxVar1->children,output,depth + 1);
    }
    particle = (xmlSchemaParticlePtr)particle->next;
    if (particle == (xmlSchemaParticlePtr)0x0) {
      return;
    }
  } while( true );
}

Assistant:

static void
xmlSchemaContentModelDump(xmlSchemaParticlePtr particle, FILE * output, int depth)
{
    xmlChar *str = NULL;
    xmlSchemaTreeItemPtr term;
    char shift[100];
    int i;

    if (particle == NULL)
	return;
    for (i = 0;((i < depth) && (i < 25));i++)
        shift[2 * i] = shift[2 * i + 1] = ' ';
    shift[2 * i] = shift[2 * i + 1] = 0;
    fprintf(output, "%s", shift);
    if (particle->children == NULL) {
	fprintf(output, "MISSING particle term\n");
	return;
    }
    term = particle->children;
    if (term == NULL) {
	fprintf(output, "(NULL)");
    } else {
	switch (term->type) {
	    case XML_SCHEMA_TYPE_ELEMENT:
		fprintf(output, "ELEM '%s'", xmlSchemaFormatQName(&str,
		    ((xmlSchemaElementPtr)term)->targetNamespace,
		    ((xmlSchemaElementPtr)term)->name));
		FREE_AND_NULL(str);
		break;
	    case XML_SCHEMA_TYPE_SEQUENCE:
		fprintf(output, "SEQUENCE");
		break;
	    case XML_SCHEMA_TYPE_CHOICE:
		fprintf(output, "CHOICE");
		break;
	    case XML_SCHEMA_TYPE_ALL:
		fprintf(output, "ALL");
		break;
	    case XML_SCHEMA_TYPE_ANY:
		fprintf(output, "ANY");
		break;
	    default:
		fprintf(output, "UNKNOWN\n");
		return;
	}
    }
    if (particle->minOccurs != 1)
	fprintf(output, " min: %d", particle->minOccurs);
    if (particle->maxOccurs >= UNBOUNDED)
	fprintf(output, " max: unbounded");
    else if (particle->maxOccurs != 1)
	fprintf(output, " max: %d", particle->maxOccurs);
    fprintf(output, "\n");
    if (term &&
	((term->type == XML_SCHEMA_TYPE_SEQUENCE) ||
	 (term->type == XML_SCHEMA_TYPE_CHOICE) ||
	 (term->type == XML_SCHEMA_TYPE_ALL)) &&
	 (term->children != NULL)) {
	xmlSchemaContentModelDump((xmlSchemaParticlePtr) term->children,
	    output, depth +1);
    }
    if (particle->next != NULL)
	xmlSchemaContentModelDump((xmlSchemaParticlePtr) particle->next,
		output, depth);
}